

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::visitDestructuringDecl(CheckerVisitor *this,DestructuringDecl *d)

{
  VarDecl *pVVar1;
  bool bVar2;
  undefined1 uVar3;
  TreeOp TVar4;
  DestructuringType DVar5;
  ValueRef *pVVar6;
  ExternalValueExpr *this_00;
  SQObjectPtr *pSVar7;
  ArenaVector<SQCompilation::VarDecl_*> *pAVar8;
  iterator ppVVar9;
  SQChar *pSVar10;
  mapped_type *ppVVar11;
  SQVM *val_00;
  DestructuringDecl *in_RSI;
  CheckerVisitor *in_RDI;
  mapped_type vv_3;
  SQObjectPtr val_3;
  VarDecl *var_4;
  iterator __end9;
  iterator __begin9;
  ArenaVector<SQCompilation::VarDecl_*> *__range9;
  SQInteger index;
  SQArray *array;
  mapped_type vv_2;
  SQObjectPtr val_2;
  SQObjectPtr key_1;
  VarDecl *var_3;
  iterator __end8;
  iterator __begin8;
  ArenaVector<SQCompilation::VarDecl_*> *__range8;
  SQInstance *inst;
  mapped_type vv_1;
  SQObjectPtr val_1;
  SQObjectPtr key;
  VarDecl *var_2;
  iterator __end7;
  iterator __begin7;
  ArenaVector<SQCompilation::VarDecl_*> *__range7;
  SQClass *klass;
  mapped_type vv;
  SQObjectPtr val;
  VarDecl *var_1;
  iterator __end6;
  iterator __begin6;
  ArenaVector<SQCompilation::VarDecl_*> *__range6;
  SQTable *table;
  VarDecl *var;
  iterator __end4;
  iterator __begin4;
  ArenaVector<SQCompilation::VarDecl_*> *__range4;
  SQObjectPtr *init;
  ValueRef *v;
  DestructuringDecl *in_stack_fffffffffffffdc8;
  ValueRef *in_stack_fffffffffffffdd0;
  SQVM *in_stack_fffffffffffffdd8;
  SQObjectPtr *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  CheckerVisitor *in_stack_fffffffffffffdf0;
  SQClass *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  SQTable *in_stack_fffffffffffffe08;
  CheckerVisitor *in_stack_fffffffffffffe10;
  DestructuringDecl *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  Expr *in_stack_fffffffffffffe70;
  mapped_type pVVar12;
  CheckerVisitor *in_stack_fffffffffffffe78;
  iterator local_168;
  iterator local_108;
  iterator local_b0;
  iterator local_58;
  iterator local_30;
  
  checkAccessNullable((CheckerVisitor *)
                      CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                      in_stack_fffffffffffffe18);
  Visitor::visitDestructuringDecl((Visitor *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  DestructuringDecl::initExpression(in_RSI);
  pVVar6 = findValueForExpr(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  if (((pVVar6 != (ValueRef *)0x0) && (bVar2 = ValueRef::hasValue(pVVar6), bVar2)) &&
     (pVVar6->expression != (Expr *)0x0)) {
    TVar4 = Node::op(&pVVar6->expression->super_Node);
    if (TVar4 == TO_EXTERNAL_VALUE) {
      this_00 = Expr::asExternal(pVVar6->expression);
      pSVar7 = ExternalValueExpr::value(this_00);
      if ((pSVar7->super_SQObject)._type == OT_NULL) {
        pAVar8 = DeclGroup::declarations(&in_RSI->super_DeclGroup);
        local_30 = ArenaVector<SQCompilation::VarDecl_*>::begin(pAVar8);
        ppVVar9 = ArenaVector<SQCompilation::VarDecl_*>::end(pAVar8);
        for (; local_30 != ppVVar9; local_30 = local_30 + 1) {
          checkDestructuredVarDefault
                    (in_stack_fffffffffffffdf0,
                     (VarDecl *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
        }
      }
      else if ((pSVar7->super_SQObject)._type == OT_TABLE) {
        DVar5 = DestructuringDecl::type(in_RSI);
        if (DVar5 == DT_TABLE) {
          pAVar8 = DeclGroup::declarations(&in_RSI->super_DeclGroup);
          local_58 = ArenaVector<SQCompilation::VarDecl_*>::begin(pAVar8);
          ppVVar9 = ArenaVector<SQCompilation::VarDecl_*>::end(pAVar8);
          for (; local_58 != ppVVar9; local_58 = local_58 + 1) {
            pVVar1 = *local_58;
            ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffdd0);
            ValueDecl::name(&pVVar1->super_ValueDecl);
            pSVar10 = ValueDecl::name(&pVVar1->super_ValueDecl);
            strlen(pSVar10);
            bVar2 = SQTable::GetStr(in_stack_fffffffffffffe08,
                                    (SQChar *)
                                    CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                                    (SQInteger)in_stack_fffffffffffffdf8,
                                    (SQObjectPtr *)in_stack_fffffffffffffdf0);
            if (bVar2) {
              ppVVar11 = std::
                         unordered_map<const_SQCompilation::Node_*,_SQCompilation::ValueRef_*,_std::hash<const_SQCompilation::Node_*>,_std::equal_to<const_SQCompilation::Node_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>_>
                         ::operator[]((unordered_map<const_SQCompilation::Node_*,_SQCompilation::ValueRef_*,_std::hash<const_SQCompilation::Node_*>,_std::equal_to<const_SQCompilation::Node_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>_>
                                       *)in_stack_fffffffffffffdd0,
                                      (key_type *)in_stack_fffffffffffffdc8);
              pVVar12 = *ppVVar11;
              pVVar12->state = VRS_INITIALIZED;
              pVVar6 = addExternalValue(in_stack_fffffffffffffe10,
                                        (SQObject *)in_stack_fffffffffffffe08,
                                        (Node *)CONCAT17(in_stack_fffffffffffffe07,
                                                         in_stack_fffffffffffffe00));
              pVVar12->expression = pVVar6->expression;
            }
            else {
              checkDestructuredVarDefault
                        (in_stack_fffffffffffffdf0,
                         (VarDecl *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
            }
            ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffdd0);
          }
        }
        else {
          report(in_RDI,(Node *)in_RSI,0x8d,"table");
        }
      }
      else if ((pSVar7->super_SQObject)._type == OT_CLASS) {
        DVar5 = DestructuringDecl::type(in_RSI);
        if (DVar5 == DT_TABLE) {
          pAVar8 = DeclGroup::declarations(&in_RSI->super_DeclGroup);
          local_b0 = ArenaVector<SQCompilation::VarDecl_*>::begin(pAVar8);
          ppVVar9 = ArenaVector<SQCompilation::VarDecl_*>::end(pAVar8);
          for (; local_b0 != ppVVar9; local_b0 = local_b0 + 1) {
            pVVar1 = *local_b0;
            SQCompilationContext::getVm(in_RDI->_ctx);
            ValueDecl::name(&pVVar1->super_ValueDecl);
            ::SQObjectPtr::SQObjectPtr
                      (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                       (SQChar *)in_stack_fffffffffffffdd0,(SQInteger)in_stack_fffffffffffffdc8);
            ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffdd0);
            bVar2 = SQClass::Get(in_stack_fffffffffffffdf8,(SQObjectPtr *)in_stack_fffffffffffffdf0,
                                 (SQObjectPtr *)
                                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
            if (bVar2) {
              ppVVar11 = std::
                         unordered_map<const_SQCompilation::Node_*,_SQCompilation::ValueRef_*,_std::hash<const_SQCompilation::Node_*>,_std::equal_to<const_SQCompilation::Node_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>_>
                         ::operator[]((unordered_map<const_SQCompilation::Node_*,_SQCompilation::ValueRef_*,_std::hash<const_SQCompilation::Node_*>,_std::equal_to<const_SQCompilation::Node_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>_>
                                       *)in_stack_fffffffffffffdd0,
                                      (key_type *)in_stack_fffffffffffffdc8);
              pVVar12 = *ppVVar11;
              pVVar12->state = VRS_INITIALIZED;
              in_stack_fffffffffffffe10 =
                   (CheckerVisitor *)
                   addExternalValue(in_stack_fffffffffffffe10,(SQObject *)in_stack_fffffffffffffe08,
                                    (Node *)CONCAT17(in_stack_fffffffffffffe07,
                                                     in_stack_fffffffffffffe00));
              pVVar12->expression =
                   *(Expr **)&in_stack_fffffffffffffe10->statementSimilarityThreshold;
            }
            else {
              checkDestructuredVarDefault
                        (in_stack_fffffffffffffdf0,
                         (VarDecl *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
            }
            ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffdd0);
            ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffdd0);
          }
        }
        else {
          report(in_RDI,(Node *)in_RSI,0x8d,"class");
        }
      }
      else if ((pSVar7->super_SQObject)._type == OT_INSTANCE) {
        DVar5 = DestructuringDecl::type(in_RSI);
        if (DVar5 == DT_TABLE) {
          pAVar8 = DeclGroup::declarations(&in_RSI->super_DeclGroup);
          local_108 = ArenaVector<SQCompilation::VarDecl_*>::begin(pAVar8);
          ppVVar9 = ArenaVector<SQCompilation::VarDecl_*>::end(pAVar8);
          for (; local_108 != ppVVar9; local_108 = local_108 + 1) {
            pVVar1 = *local_108;
            val_00 = SQCompilationContext::getVm(in_RDI->_ctx);
            ValueDecl::name(&pVVar1->super_ValueDecl);
            ::SQObjectPtr::SQObjectPtr
                      (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                       (SQChar *)in_stack_fffffffffffffdd0,(SQInteger)in_stack_fffffffffffffdc8);
            ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffdd0);
            uVar3 = SQInstance::Get((SQInstance *)in_stack_fffffffffffffdd8,
                                    (SQObjectPtr *)in_stack_fffffffffffffdd0,
                                    (SQObjectPtr *)in_stack_fffffffffffffdc8);
            if ((bool)uVar3) {
              ppVVar11 = std::
                         unordered_map<const_SQCompilation::Node_*,_SQCompilation::ValueRef_*,_std::hash<const_SQCompilation::Node_*>,_std::equal_to<const_SQCompilation::Node_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>_>
                         ::operator[]((unordered_map<const_SQCompilation::Node_*,_SQCompilation::ValueRef_*,_std::hash<const_SQCompilation::Node_*>,_std::equal_to<const_SQCompilation::Node_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>_>
                                       *)in_stack_fffffffffffffdd0,
                                      (key_type *)in_stack_fffffffffffffdc8);
              pVVar12 = *ppVVar11;
              pVVar12->state = VRS_INITIALIZED;
              in_stack_fffffffffffffdf0 =
                   (CheckerVisitor *)
                   addExternalValue(in_stack_fffffffffffffe10,(SQObject *)val_00,
                                    (Node *)CONCAT17(uVar3,in_stack_fffffffffffffe00));
              pVVar12->expression =
                   *(Expr **)&in_stack_fffffffffffffdf0->statementSimilarityThreshold;
            }
            else {
              checkDestructuredVarDefault
                        (in_stack_fffffffffffffdf0,
                         (VarDecl *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
            }
            ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffdd0);
            ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffdd0);
          }
        }
        else {
          report(in_RDI,(Node *)in_RSI,0x8d,"instance");
        }
      }
      else if ((pSVar7->super_SQObject)._type == OT_ARRAY) {
        DVar5 = DestructuringDecl::type(in_RSI);
        if (DVar5 == DT_ARRAY) {
          pAVar8 = DeclGroup::declarations(&in_RSI->super_DeclGroup);
          local_168 = ArenaVector<SQCompilation::VarDecl_*>::begin(pAVar8);
          ppVVar9 = ArenaVector<SQCompilation::VarDecl_*>::end(pAVar8);
          for (; local_168 != ppVVar9; local_168 = local_168 + 1) {
            ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffdd0);
            in_stack_fffffffffffffdef =
                 SQArray::Get((SQArray *)in_stack_fffffffffffffdf8,
                              (SQInteger)in_stack_fffffffffffffdf0,
                              (SQObjectPtr *)
                              CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
            if ((bool)in_stack_fffffffffffffdef) {
              ppVVar11 = std::
                         unordered_map<const_SQCompilation::Node_*,_SQCompilation::ValueRef_*,_std::hash<const_SQCompilation::Node_*>,_std::equal_to<const_SQCompilation::Node_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>_>
                         ::operator[]((unordered_map<const_SQCompilation::Node_*,_SQCompilation::ValueRef_*,_std::hash<const_SQCompilation::Node_*>,_std::equal_to<const_SQCompilation::Node_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>_>
                                       *)in_stack_fffffffffffffdd0,
                                      (key_type *)in_stack_fffffffffffffdc8);
              pVVar12 = *ppVVar11;
              pVVar12->state = VRS_INITIALIZED;
              in_stack_fffffffffffffdd0 =
                   addExternalValue(in_stack_fffffffffffffe10,(SQObject *)in_stack_fffffffffffffe08,
                                    (Node *)CONCAT17(in_stack_fffffffffffffe07,
                                                     in_stack_fffffffffffffe00));
              pVVar12->expression = in_stack_fffffffffffffdd0->expression;
            }
            else {
              checkDestructuredVarDefault
                        (in_stack_fffffffffffffdf0,
                         (VarDecl *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
            }
            ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffdd0);
          }
        }
        else {
          report(in_RDI,(Node *)in_RSI,0x8d,"array");
        }
      }
      else {
        pSVar10 = GetTypeName((SQObjectPtr *)0x197d61);
        report(in_RDI,(Node *)in_RSI,0x8d,pSVar10);
      }
    }
    else {
      TVar4 = Node::op(&pVVar6->expression->super_Node);
      if (TVar4 != TO_TABLE) {
        Node::op(&pVVar6->expression->super_Node);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::visitDestructuringDecl(DestructuringDecl *d) {

  checkAccessNullable(d);

  Visitor::visitDestructuringDecl(d);

  if (auto v = findValueForExpr(d->initExpression()); v && v->hasValue() && v->expression) {
    if (v->expression->op() == TO_EXTERNAL_VALUE) {
      const auto &init = v->expression->asExternal()->value();
      if (sq_isnull(init)) {
        for (auto var : d->declarations()) {
          checkDestructuredVarDefault(var);
        }
      }
      else if (sq_istable(init)) {
        if (d->type() == DT_TABLE) {
          auto table = _table(init);
          for (auto var : d->declarations()) {
            SQObjectPtr val;
            if (table->GetStr(var->name(), strlen(var->name()), val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "table");
        }
      }
      else if (sq_isclass(init)) {
        if (d->type() == DT_TABLE) {
          auto klass = _class(init);
          for (auto var : d->declarations()) {
            SQObjectPtr key(_ctx.getVm(), var->name());
            SQObjectPtr val;
            if (klass->Get(key, val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "class");
        }
      }
      else if (sq_isinstance(init)) {
        if (d->type() == DT_TABLE) {
          auto inst = _instance(init);
          for (auto var : d->declarations()) {
            SQObjectPtr key(_ctx.getVm(), var->name());
            SQObjectPtr val;
            if (inst->Get(key, val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "instance");
        }
      }
      else if (sq_isarray(init)) {
        if (d->type() == DT_ARRAY) {
          auto array = _array(init);
          SQInteger index = 0;
          for (auto var : d->declarations()) {
            SQObjectPtr val;
            if (array->Get(index, val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
            index++;
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "array");
        }
      }
      else {
        report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, GetTypeName(init));
      }
    }
    else if (v->expression->op() == TO_TABLE) {
      // TODO: check table destructuring
    }
    else if (v->expression->op() == TO_ARRAYEXPR) {
      // TODO: check array destructuring
    }
  }
}